

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsLoadFS::Read<tcu::Vector<float,4>>
          (BasicAllFormatsLoadFS *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value,GLenum format,GLenum type)

{
  CallLogWrapper *this_00;
  ShaderImageLoadStoreBase *this_01;
  bool bVar1;
  GLuint program;
  ostream *poVar2;
  TestLog **this_02;
  undefined8 uVar3;
  GLenum e;
  GLenum e_00;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  char *pcVar4;
  ulong uVar5;
  GLuint texture;
  string local_268;
  GLuint m_buffer;
  undefined4 uStack_244;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data;
  string local_208;
  string local_1e8;
  ShaderImageLoadStoreBase local_1c8 [16];
  ShaderImageLoadStoreBase local_1b8 [16];
  ShortByteData<tcu::Vector<float,_4>_> d;
  
  this_01 = (ShaderImageLoadStoreBase *)(ulong)internalformat;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&d);
  poVar2 = std::operator<<((ostream *)&d,"\n#define KSIZE 11\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_268,this_01,e);
  poVar2 = std::operator<<(poVar2,(string *)&local_268);
  pcVar4 = ", binding = 1) readonly uniform ";
  poVar2 = std::operator<<(poVar2,", binding = 1) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_1e8,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  pcVar4 = "image2D g_image;\nlayout(std430) buffer OutputBuffer {\n  ";
  poVar2 = std::operator<<(poVar2,"image2D g_image;\nlayout(std430) buffer OutputBuffer {\n  ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_208,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&local_208);
  pcVar4 = "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
  ;
  poVar2 = std::operator<<(poVar2,
                           "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)&out_data,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&out_data);
  pcVar4 = 
  "vec4 v = imageLoad(g_image, coord);\n  data[coord.y * KSIZE + coord.x] = v;\n  //data[coord.y * KSIZE + coord.x] = "
  ;
  poVar2 = std::operator<<(poVar2,
                           "vec4 v = imageLoad(g_image, coord);\n  data[coord.y * KSIZE + coord.x] = v;\n  //data[coord.y * KSIZE + coord.x] = "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)&texture,(ShaderImageLoadStoreBase *)pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)&texture);
  poVar2 = std::operator<<(poVar2,"vec4");
  poVar2 = tcu::operator<<(poVar2,expected_value);
  std::operator<<(poVar2,";\n  discard;\n}");
  std::__cxx11::string::~string((string *)&texture);
  std::__cxx11::string::~string((string *)&out_data);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&d);
  program = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)CONCAT44(uStack_244,m_buffer),false,false);
  std::__cxx11::string::~string((string *)&m_buffer);
  glcts::anon_unknown_0::ShortByteData<tcu::Vector<float,_4>_>::ShortByteData
            (&d,0xb,value,internalformat,format);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,0xb,0xb);
  if (((internalformat != 0x8d88) && (internalformat != 0x8d76)) &&
     (bVar1 = glcts::anon_unknown_0::Bytes(internalformat),
     d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
     _M_start = (pointer)d.data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, bVar1)) {
    d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  }
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,0,0,0,0xb,0xb,format,type,
             d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,0xb,0xb);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,texture,0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&out_data,0x79,(allocator_type *)&local_268);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,0x790,
             out_data.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar3 = 0x790;
  this_02 = (TestLog **)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x790,1);
  uVar5 = 0;
  do {
    if (uVar5 == 0x79) {
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
LAB_00c4b528:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&out_data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      glcts::anon_unknown_0::ShortByteData<tcu::Vector<float,_4>_>::~ShortByteData(&d);
      return 0x78 < uVar5;
    }
    bVar1 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this_02,expected_value,(vec4 *)this_01,
                       (GLenum)uVar3);
    if (!bVar1) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1b8,(Vector<float,_4> *)this_02);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&local_268,local_1b8,v);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1c8,expected_value);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&local_1e8,local_1c8,v_00);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_208,this_01,e_00);
      glcts::anon_unknown_0::Output
                ("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
                 uVar5 & 0xffffffff,local_268._M_dataplus._M_p,local_1e8._M_dataplus._M_p,
                 local_208._M_dataplus._M_p,1);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_268);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
      goto LAB_00c4b528;
    }
    uVar5 = uVar5 + 1;
    this_02 = this_02 + 2;
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value, GLenum format, GLenum type)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		GLuint			 program = BuildProgram(src_vs, GenFS(internalformat, expected_value).c_str());
		const int		 kSize   = 11;
		ShortByteData<T> d(kSize, value, internalformat, format);
		GLuint			 texture;
		glGenTextures(1, &texture);
		GLuint unit = 1;
		glBindTexture(GL_TEXTURE_2D, texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		if (Shorts(internalformat))
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datas[0]);
		else if (Bytes(internalformat))
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datab[0]);
		else
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glViewport(0, 0, kSize, kSize);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(program);
		glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindVertexArray(m_vao);

		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n", i,
					   ToString(map_data[i]).c_str(), ToString(expected_value).c_str(),
					   FormatEnumToString(internalformat).c_str(), unit);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteTextures(1, &texture);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(1, &texture);
		glDeleteBuffers(1, &m_buffer);
		return true;
	}